

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::executeAccessingBoundingBoxType
               (NegativeTestContext *ctx,string *builtInTypeName,GLSLVersion glslVersion)

{
  bool bVar1;
  ostream *poVar2;
  string local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  string local_5e8 [32];
  string local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  string local_4c8 [32];
  string local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  string local_328 [32];
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_1f8 [8];
  string extensionTess;
  string extensionPrim;
  string version;
  ostringstream sourceStream;
  GLSLVersion glslVersion_local;
  string *builtInTypeName_local;
  NegativeTestContext *ctx_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(version.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(extensionPrim.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(extensionTess.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_1f8);
  if (glslVersion == GLSL_VERSION_310_ES) {
    std::__cxx11::string::operator=
              ((string *)(extensionPrim.field_2._M_local_buf + 8),"#version 310 es\n");
    std::__cxx11::string::operator=
              ((string *)(extensionTess.field_2._M_local_buf + 8),
               "#extension GL_EXT_primitive_bounding_box : require\n");
    std::__cxx11::string::operator=(local_1f8,"#extension GL_EXT_tessellation_shader : require\n");
  }
  else if (2 < (int)glslVersion) {
    std::__cxx11::string::operator=
              ((string *)(extensionPrim.field_2._M_local_buf + 8),"#version 320 es\n");
    std::__cxx11::string::operator=((string *)(extensionTess.field_2._M_local_buf + 8),"");
    std::__cxx11::string::operator=(local_1f8,"");
  }
  std::operator+(&local_268,"cannot access built-in type ",builtInTypeName);
  std::operator+(&local_248,&local_268,"[]");
  std::operator+(&local_228,&local_248," in vertex shader");
  NegativeTestContext::beginSection(ctx,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  poVar2 = std::operator<<((ostream *)(version.field_2._M_local_buf + 8),
                           (string *)(extensionPrim.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,(string *)(extensionTess.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,"void main()\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  std::operator+(&local_2a8,"\t",builtInTypeName);
  std::operator+(&local_288,&local_2a8,"[0] = vec4(1.0, 1.0, 1.0, 1.0);\n");
  poVar2 = std::operator<<(poVar2,(string *)&local_288);
  std::operator+(&local_2e8,"\tgl_Position = ",builtInTypeName);
  std::operator+(&local_2c8,&local_2e8,"[0];\n");
  poVar2 = std::operator<<(poVar2,(string *)&local_2c8);
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::ostringstream::str();
  verifyShader(ctx,SHADERTYPE_VERTEX,&local_308,EXPECT_RESULT_FAIL);
  std::__cxx11::string::~string((string *)&local_308);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string(local_328);
  std::__cxx11::ostringstream::str((string *)(version.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_328);
  bVar1 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_TESSELLATION_EVALUATION);
  if (bVar1) {
    std::operator+(&local_388,"cannot access built-in type ",builtInTypeName);
    std::operator+(&local_368,&local_388,"[]");
    std::operator+(&local_348,&local_368," in tessellation evaluation shader");
    NegativeTestContext::beginSection(ctx,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    poVar2 = std::operator<<((ostream *)(version.field_2._M_local_buf + 8),
                             (string *)(extensionPrim.field_2._M_local_buf + 8));
    poVar2 = std::operator<<(poVar2,(string *)(extensionTess.field_2._M_local_buf + 8));
    poVar2 = std::operator<<(poVar2,local_1f8);
    poVar2 = std::operator<<(poVar2,"layout (triangles, equal_spacing, ccw) in;\n");
    poVar2 = std::operator<<(poVar2,"void main()\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    std::operator+(&local_3c8,"\t",builtInTypeName);
    std::operator+(&local_3a8,&local_3c8,"[0] = vec4(1.0, 1.0, 1.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,(string *)&local_3a8);
    std::operator+(&local_408,"\tgl_Position = (\tgl_TessCoord.x * ",builtInTypeName);
    std::operator+(&local_3e8,&local_408,"[0] +\n");
    poVar2 = std::operator<<(poVar2,(string *)&local_3e8);
    std::operator+(&local_448,"\t\t\t\t\tgl_TessCoord.y * ",builtInTypeName);
    std::operator+(&local_428,&local_448,"[0] +\n");
    poVar2 = std::operator<<(poVar2,(string *)&local_428);
    std::operator+(&local_488,"\t\t\t\t\tgl_TessCoord.z * ",builtInTypeName);
    std::operator+(&local_468,&local_488,"[0]);\n");
    poVar2 = std::operator<<(poVar2,(string *)&local_468);
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::ostringstream::str();
    verifyShader(ctx,SHADERTYPE_TESSELLATION_EVALUATION,&local_4a8,EXPECT_RESULT_FAIL);
    std::__cxx11::string::~string((string *)&local_4a8);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string(local_4c8);
    std::__cxx11::ostringstream::str((string *)(version.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_4c8);
  }
  bVar1 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_GEOMETRY);
  if (bVar1) {
    std::operator+(&local_528,"cannot access built-in type ",builtInTypeName);
    std::operator+(&local_508,&local_528,"[]");
    std::operator+(&local_4e8,&local_508," in geometry shader");
    NegativeTestContext::beginSection(ctx,&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_528);
    poVar2 = std::operator<<((ostream *)(version.field_2._M_local_buf + 8),
                             (string *)(extensionPrim.field_2._M_local_buf + 8));
    poVar2 = std::operator<<(poVar2,(string *)(extensionTess.field_2._M_local_buf + 8));
    poVar2 = std::operator<<(poVar2,"layout (triangles) in;\n");
    poVar2 = std::operator<<(poVar2,"layout (triangle_strip, max_vertices = 3) out;\n");
    poVar2 = std::operator<<(poVar2,"void main()\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    std::operator+(&local_568,"\t",builtInTypeName);
    std::operator+(&local_548,&local_568,"[0] = vec4(1.0, 1.0, 1.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,(string *)&local_548);
    poVar2 = std::operator<<(poVar2,"\tfor (int idx = 0; idx < 3; idx++)\n");
    poVar2 = std::operator<<(poVar2,"\t{\n");
    std::operator+(&local_5a8,"\t\tgl_Position = gl_in[idx].gl_Position * ",builtInTypeName);
    std::operator+(&local_588,&local_5a8,"[0];\n");
    poVar2 = std::operator<<(poVar2,(string *)&local_588);
    poVar2 = std::operator<<(poVar2,"\t\tEmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\t}\n");
    poVar2 = std::operator<<(poVar2,"\tEndPrimitive();\n");
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::~string((string *)&local_588);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::__cxx11::string::~string((string *)&local_548);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::ostringstream::str();
    verifyShader(ctx,SHADERTYPE_GEOMETRY,&local_5c8,EXPECT_RESULT_FAIL);
    std::__cxx11::string::~string((string *)&local_5c8);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string(local_5e8);
    std::__cxx11::ostringstream::str((string *)(version.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_5e8);
  }
  std::operator+(&local_648,"cannot access built-in type ",builtInTypeName);
  std::operator+(&local_628,&local_648,"[]");
  std::operator+(&local_608,&local_628," in fragment shader");
  NegativeTestContext::beginSection(ctx,&local_608);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_648);
  poVar2 = std::operator<<((ostream *)(version.field_2._M_local_buf + 8),
                           (string *)(extensionPrim.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,(string *)(extensionTess.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,"layout (location = 0) out mediump vec4 fs_colour;\n");
  poVar2 = std::operator<<(poVar2,"void main()\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  std::operator+(&local_688,"\t",builtInTypeName);
  std::operator+(&local_668,&local_688,"[0] = vec4(1.0, 1.0, 1.0, 1.0);\n");
  poVar2 = std::operator<<(poVar2,(string *)&local_668);
  std::operator+(&local_6c8,"\tfs_colour = ",builtInTypeName);
  std::operator+(&local_6a8,&local_6c8,"[0];\n");
  poVar2 = std::operator<<(poVar2,(string *)&local_6a8);
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::ostringstream::str();
  verifyShader(ctx,SHADERTYPE_FRAGMENT,&local_6e8,EXPECT_RESULT_FAIL);
  std::__cxx11::string::~string((string *)&local_6e8);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string((string *)(extensionTess.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(extensionPrim.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(version.field_2._M_local_buf + 8));
  return;
}

Assistant:

void executeAccessingBoundingBoxType (NegativeTestContext& ctx, const std::string builtInTypeName, glu::GLSLVersion glslVersion)
{
	std::ostringstream	sourceStream;
	std::string			version;
	std::string			extensionPrim;
	std::string			extensionTess;

	if (glslVersion == glu::GLSL_VERSION_310_ES)
	{
		version = "#version 310 es\n";
		extensionPrim = "#extension GL_EXT_primitive_bounding_box : require\n";
		extensionTess = "#extension GL_EXT_tessellation_shader : require\n";
	}
	else if (glslVersion >= glu::GLSL_VERSION_320_ES)
	{
		version = "#version 320 es\n";
		extensionPrim = "";
		extensionTess = "";
	}
	else
	{
		DE_FATAL("error: context below 3.1 and not supported");
	}

	ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in vertex shader");
	sourceStream	<< version
					<< extensionPrim
					<< "void main()\n"
					<< "{\n"
					<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
					<< "	gl_Position = " + builtInTypeName + "[0];\n"
					<< "}\n";
	verifyShader(ctx, glu::SHADERTYPE_VERTEX, sourceStream.str(), EXPECT_RESULT_FAIL);
	ctx.endSection();

	sourceStream.str(std::string());

	if (ctx.isShaderSupported(glu::SHADERTYPE_TESSELLATION_EVALUATION))
	{
		ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in tessellation evaluation shader");
		sourceStream	<< version
						<< extensionPrim
						<< extensionTess
						<< "layout (triangles, equal_spacing, ccw) in;\n"
						<< "void main()\n"
						<< "{\n"
						<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
						<< "	gl_Position = (	gl_TessCoord.x * " +  builtInTypeName + "[0] +\n"
						<< "					gl_TessCoord.y * " +  builtInTypeName + "[0] +\n"
						<< "					gl_TessCoord.z * " +  builtInTypeName + "[0]);\n"
						<< "}\n";
		verifyShader(ctx, glu::SHADERTYPE_TESSELLATION_EVALUATION, sourceStream.str(), EXPECT_RESULT_FAIL);
		ctx.endSection();

		sourceStream.str(std::string());
	}

	if (ctx.isShaderSupported(glu::SHADERTYPE_GEOMETRY))
	{
		ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in geometry shader");
		sourceStream	<< version
						<< extensionPrim
						<< "layout (triangles) in;\n"
						<< "layout (triangle_strip, max_vertices = 3) out;\n"
						<< "void main()\n"
						<< "{\n"
						<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
						<< "	for (int idx = 0; idx < 3; idx++)\n"
						<< "	{\n"
						<< "		gl_Position = gl_in[idx].gl_Position * " + builtInTypeName + "[0];\n"
						<< "		EmitVertex();\n"
						<< "	}\n"
						<< "	EndPrimitive();\n"
						<< "}\n";
		verifyShader(ctx, glu::SHADERTYPE_GEOMETRY, sourceStream.str(), EXPECT_RESULT_FAIL);
		ctx.endSection();

		sourceStream.str(std::string());
	}

	ctx.beginSection("cannot access built-in type " + builtInTypeName + "[]" + " in fragment shader");
	sourceStream	<< version
					<< extensionPrim
					<< "layout (location = 0) out mediump vec4 fs_colour;\n"
					<< "void main()\n"
					<< "{\n"
					<< "	" + builtInTypeName + "[0] = vec4(1.0, 1.0, 1.0, 1.0);\n"
					<< "	fs_colour = " + builtInTypeName + "[0];\n"
					<< "}\n";
	verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, sourceStream.str(), EXPECT_RESULT_FAIL);
	ctx.endSection();
}